

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O1

bool YAML::IsNullString(string *str)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if (str->_M_string_length != 0) {
    iVar1 = std::__cxx11::string::compare((char *)str);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)str);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)str);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)str);
          bVar2 = iVar1 == 0;
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool IsNullString(const std::string& str) {
  return str.empty() || str == "~" || str == "null" || str == "Null" ||
         str == "NULL";
}